

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  ulong uVar16;
  ulong uVar17;
  v4sf pow2n;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0_1;
  v4sf fx;
  v4sf tmp_1;
  v4sf y;
  v4sf z;
  v4sf tmp;
  v4sf mask;
  v4sf e;
  v4sf invalid_mask;
  v4sf one;
  v4si emm0;
  int local_d3c;
  float *local_d28;
  undefined1 (*local_d18) [16];
  float local_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c08;
  undefined8 uStack_c00;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  undefined8 local_a78;
  undefined8 uStack_a70;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  __m128 _outp;
  __m128 _p;
  __m128 _b;
  int i;
  int size;
  binary_op_pow op;
  int elempack_local;
  int w_local;
  float *outptr_local;
  float *ptr1_local;
  
  local_d3c = 0;
  fVar1 = *ptr1;
  local_d28 = outptr;
  local_d18 = (undefined1 (*) [16])ptr;
  for (; local_d3c + 3 < w * elempack; local_d3c = local_d3c + 4) {
    local_c8 = (float)*(undefined8 *)*local_d18;
    fStack_c4 = (float)((ulong)*(undefined8 *)*local_d18 >> 0x20);
    fStack_c0 = (float)*(undefined8 *)(*local_d18 + 8);
    fStack_bc = (float)((ulong)*(undefined8 *)(*local_d18 + 8) >> 0x20);
    auVar3._8_8_ = 0x80000000800000;
    auVar3._0_8_ = 0x80000000800000;
    auVar5 = maxps(*local_d18,auVar3);
    local_a78 = auVar5._0_8_;
    uStack_a70 = auVar5._8_8_;
    local_a8 = auVar5._0_4_;
    uStack_a4 = auVar5._4_4_;
    uStack_a0 = auVar5._8_4_;
    uStack_9c = auVar5._12_4_;
    uVar4 = local_a78 & 0x807fffff807fffff | 0x3f0000003f000000;
    uVar6 = uStack_a70 & 0x807fffff807fffff | 0x3f0000003f000000;
    elempack_local = (int)uVar4;
    w_local = (int)(uVar4 >> 0x20);
    outptr_local._0_4_ = (float)uVar6;
    outptr_local._4_4_ = (float)(uVar6 >> 0x20);
    uVar4 = uVar4 & CONCAT44(-(uint)((float)w_local < 0.70710677),
                             -(uint)((float)elempack_local < 0.70710677));
    uVar6 = uVar6 & CONCAT44(-(uint)(outptr_local._4_4_ < 0.70710677),
                             -(uint)(outptr_local._0_4_ < 0.70710677));
    uVar16 = CONCAT44(-(uint)((float)w_local < 0.70710677),
                      -(uint)((float)elempack_local < 0.70710677)) & 0x3f8000003f800000;
    uVar17 = CONCAT44(-(uint)(outptr_local._4_4_ < 0.70710677),
                      -(uint)(outptr_local._0_4_ < 0.70710677)) & 0x3f8000003f800000;
    local_a08 = (float)uVar16;
    fStack_a04 = (float)(uVar16 >> 0x20);
    fStack_a00 = (float)uVar17;
    fStack_9fc = (float)(uVar17 >> 0x20);
    local_a08 = ((float)(int)((local_a8 >> 0x17) - 0x7f) + 1.0) - local_a08;
    fStack_a04 = ((float)(int)((uStack_a4 >> 0x17) - 0x7f) + 1.0) - fStack_a04;
    fStack_a00 = ((float)(int)((uStack_a0 >> 0x17) - 0x7f) + 1.0) - fStack_a00;
    fStack_9fc = ((float)(int)((uStack_9c >> 0x17) - 0x7f) + 1.0) - fStack_9fc;
    local_a48 = (float)uVar4;
    fStack_a44 = (float)(uVar4 >> 0x20);
    fStack_a40 = (float)uVar6;
    fStack_a3c = (float)(uVar6 >> 0x20);
    local_a48 = ((float)elempack_local - 1.0) + local_a48;
    fStack_a44 = ((float)w_local - 1.0) + fStack_a44;
    fStack_a40 = (outptr_local._0_4_ - 1.0) + fStack_a40;
    fStack_a3c = (outptr_local._4_4_ - 1.0) + fStack_a3c;
    local_a78 = CONCAT44(fStack_a04 * 0.6933594 +
                         fStack_a44 +
                         ((fStack_a04 * -0.00021219444 +
                          ((((((((fStack_a44 * 0.070376836 + -0.1151461) * fStack_a44 + 0.116769984)
                                * fStack_a44 + -0.12420141) * fStack_a44 + 0.14249323) * fStack_a44
                             + -0.16668057) * fStack_a44 + 0.20000714) * fStack_a44 + -0.24999994) *
                           fStack_a44 + 0.3333333) * fStack_a44 * fStack_a44 * fStack_a44) -
                         fStack_a44 * fStack_a44 * 0.5),
                         local_a08 * 0.6933594 +
                         local_a48 +
                         ((local_a08 * -0.00021219444 +
                          ((((((((local_a48 * 0.070376836 + -0.1151461) * local_a48 + 0.116769984) *
                                local_a48 + -0.12420141) * local_a48 + 0.14249323) * local_a48 +
                             -0.16668057) * local_a48 + 0.20000714) * local_a48 + -0.24999994) *
                           local_a48 + 0.3333333) * local_a48 * local_a48 * local_a48) -
                         local_a48 * local_a48 * 0.5));
    uStack_a70._0_4_ =
         fStack_a00 * 0.6933594 +
         fStack_a40 +
         ((fStack_a00 * -0.00021219444 +
          ((((((((fStack_a40 * 0.070376836 + -0.1151461) * fStack_a40 + 0.116769984) * fStack_a40 +
               -0.12420141) * fStack_a40 + 0.14249323) * fStack_a40 + -0.16668057) * fStack_a40 +
            0.20000714) * fStack_a40 + -0.24999994) * fStack_a40 + 0.3333333) * fStack_a40 *
          fStack_a40 * fStack_a40) - fStack_a40 * fStack_a40 * 0.5);
    uStack_a70._4_4_ =
         fStack_9fc * 0.6933594 +
         fStack_a3c +
         ((fStack_9fc * -0.00021219444 +
          ((((((((fStack_a3c * 0.070376836 + -0.1151461) * fStack_a3c + 0.116769984) * fStack_a3c +
               -0.12420141) * fStack_a3c + 0.14249323) * fStack_a3c + -0.16668057) * fStack_a3c +
            0.20000714) * fStack_a3c + -0.24999994) * fStack_a3c + 0.3333333) * fStack_a3c *
          fStack_a3c * fStack_a3c) - fStack_a3c * fStack_a3c * 0.5);
    local_a78 = local_a78 | CONCAT44(-(uint)(fStack_c4 <= 0.0),-(uint)(local_c8 <= 0.0));
    uStack_a70 = uStack_a70 | CONCAT44(-(uint)(fStack_bc <= 0.0),-(uint)(fStack_c0 <= 0.0));
    local_c98 = (float)local_a78;
    fStack_c94 = (float)(local_a78 >> 0x20);
    fStack_c90 = (float)uStack_a70;
    fStack_c8c = (float)(uStack_a70 >> 0x20);
    local_c08 = CONCAT44(fVar1 * fStack_c94,fVar1 * local_c98);
    uStack_c00._0_4_ = fVar1 * fStack_c90;
    uStack_c00._4_4_ = fVar1 * fStack_c8c;
    auVar2._8_8_ = uStack_c00;
    auVar2._0_8_ = local_c08;
    auVar15._8_8_ = 0x42b0c0a542b0c0a5;
    auVar15._0_8_ = 0x42b0c0a542b0c0a5;
    auVar15 = minps(auVar2,auVar15);
    auVar5._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar5._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar5 = maxps(auVar15,auVar5);
    local_b48 = auVar5._0_4_;
    fStack_b44 = auVar5._4_4_;
    fStack_b40 = auVar5._8_4_;
    fStack_b3c = auVar5._12_4_;
    fVar7 = local_b48 * 1.442695 + 0.5;
    fVar9 = fStack_b44 * 1.442695 + 0.5;
    fVar11 = fStack_b40 * 1.442695 + 0.5;
    fVar13 = fStack_b3c * 1.442695 + 0.5;
    fVar8 = (float)(int)fVar7;
    fVar10 = (float)(int)fVar9;
    fVar12 = (float)(int)fVar11;
    fVar14 = (float)(int)fVar13;
    local_c58 = CONCAT44(-(uint)(fVar9 < fVar10),-(uint)(fVar7 < fVar8));
    uStack_c50 = CONCAT44(-(uint)(fVar13 < fVar14),-(uint)(fVar11 < fVar12));
    local_bb8 = (float)(local_c58 & 0x3f8000003f800000);
    fStack_bb4 = (float)((local_c58 & 0x3f8000003f800000) >> 0x20);
    fStack_bb0 = (float)(uStack_c50 & 0x3f8000003f800000);
    fStack_bac = (float)((uStack_c50 & 0x3f8000003f800000) >> 0x20);
    fVar8 = fVar8 - local_bb8;
    fVar10 = fVar10 - fStack_bb4;
    fVar12 = fVar12 - fStack_bb0;
    fVar14 = fVar14 - fStack_bac;
    fVar7 = (local_b48 - fVar8 * 0.6933594) - fVar8 * -0.00021219444;
    fVar9 = (fStack_b44 - fVar10 * 0.6933594) - fVar10 * -0.00021219444;
    fVar11 = (fStack_b40 - fVar12 * 0.6933594) - fVar12 * -0.00021219444;
    fVar13 = (fStack_b3c - fVar14 * 0.6933594) - fVar14 * -0.00021219444;
    local_c68 = CONCAT44(((((((fVar9 * 0.00019875691 + 0.0013981999) * fVar9 + 0.008333452) * fVar9
                            + 0.041665796) * fVar9 + 0.16666666) * fVar9 + 0.5) * fVar9 * fVar9 +
                          fVar9 + 1.0) * (float)((int)fVar10 + 0x7f),
                         ((((((fVar7 * 0.00019875691 + 0.0013981999) * fVar7 + 0.008333452) * fVar7
                            + 0.041665796) * fVar7 + 0.16666666) * fVar7 + 0.5) * fVar7 * fVar7 +
                          fVar7 + 1.0) * (float)(((int)fVar8 + 0x7f) * 0x800000));
    uStack_c60 = CONCAT44(((((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) *
                              fVar13 + 0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5) *
                           fVar13 * fVar13 + fVar13 + 1.0) * (float)((int)fVar14 + 0x7f),
                          ((((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) *
                              fVar11 + 0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5) *
                           fVar11 * fVar11 + fVar11 + 1.0) * (float)((int)fVar12 + 0x7f));
    *(undefined8 *)local_d28 = local_c68;
    *(undefined8 *)(local_d28 + 2) = uStack_c60;
    local_d18 = local_d18 + 1;
    local_d28 = local_d28 + 4;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}